

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O1

void __thiscall
xmrig::Client::parseNotification(Client *this,char *method,Value *params,Value *error)

{
  char *pcVar1;
  IClientListener *pIVar2;
  bool bVar3;
  int iVar4;
  Type pGVar5;
  Value *pVVar6;
  Type pGVar7;
  int code;
  int local_24;
  
  if ((error->data_).f.flags == 3) {
    if (((this->super_BaseClient).m_quiet == false) &&
       ((this->super_BaseClient).m_failures < (long)(this->super_BaseClient).m_retries)) {
      pcVar1 = (this->super_BaseClient).m_pool.m_url.m_url.m_data;
      pGVar5 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)error,"message");
      pGVar7 = (Type)((ulong)(pGVar5->data_).s.str & 0xffffffffffff);
      if (((pGVar5->data_).f.flags >> 0xc & 1) != 0) {
        pGVar7 = pGVar5;
      }
      pGVar5 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)error,"code");
      Log::print(ERR,"[%s] error: \"%s\", code: %d",pcVar1,pGVar7,(ulong)(pGVar5->data_).s.length);
      return;
    }
  }
  else if (method != (char *)0x0) {
    iVar4 = strcmp(method,"job");
    if (iVar4 != 0) {
      Log::print(WARNING,"[%s] unsupported method: \"%s\"",
                 (this->super_BaseClient).m_pool.m_url.m_url.m_data,method);
      return;
    }
    pVVar6 = params;
    bVar3 = parseJob(this,params,&local_24);
    if (bVar3) {
      pIVar2 = (this->super_BaseClient).m_listener;
      (*pIVar2->_vptr_IClientListener[3])(pIVar2,this,&(this->super_BaseClient).m_job,params);
    }
    else {
      close(this,(int)pVVar6);
    }
  }
  return;
}

Assistant:

void xmrig::Client::parseNotification(const char *method, const rapidjson::Value &params, const rapidjson::Value &error)
{
    if (error.IsObject()) {
        if (!isQuiet()) {
            LOG_ERR("[%s] error: \"%s\", code: %d", url(), error["message"].GetString(), error["code"].GetInt());
        }
        return;
    }

    if (!method) {
        return;
    }

    if (strcmp(method, "job") == 0) {
        int code = -1;
        if (parseJob(params, &code)) {
            m_listener->onJobReceived(this, m_job, params);
        }
        else {
            close();
        }

        return;
    }

    LOG_WARN("[%s] unsupported method: \"%s\"", url(), method);
}